

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

unsigned_long
rcg::anon_unknown_6::getBufferPartValue<unsigned_long>
          (shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,void *buffer,uint32_t part,
          BUFFER_PART_INFO_CMD cmd)

{
  size_t size;
  unsigned_long ret;
  INFO_DATATYPE type;
  size_t local_20;
  unsigned_long local_18;
  INFO_DATATYPE local_c;
  
  local_18 = 0;
  local_20 = 8;
  if (buffer == (void *)0x0 || stream == (void *)0x0) {
    local_18 = 0;
  }
  else {
    (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      DSGetBufferPartInfo)(stream,buffer,part,cmd,&local_c,&local_18,&local_20);
  }
  return local_18;
}

Assistant:

inline T getBufferPartValue(const std::shared_ptr<const GenTLWrapper> &gentl,
                                              void *stream, void *buffer, uint32_t part,
                                              GenTL::BUFFER_PART_INFO_CMD cmd)
{
  T ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(T);

  if (stream != 0 && buffer != 0)
  {
    gentl->DSGetBufferPartInfo(stream, buffer, part, cmd, &type, &ret, &size);
  }

  return ret;
}